

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::remap_hlsl_resource_binding
          (CompilerHLSL *this,HLSLBindingFlagBits type,uint32_t *desc_set,uint32_t *binding)

{
  bool bVar1;
  pointer ppVar2;
  pair<spirv_cross::HLSLResourceBinding,_bool> *remap;
  key_type local_3c;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
  local_30;
  iterator itr;
  uint32_t *binding_local;
  uint32_t *desc_set_local;
  HLSLBindingFlagBits type_local;
  CompilerHLSL *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
             )(_Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
               )binding;
  local_3c.model = Compiler::get_execution_model((Compiler *)this);
  local_3c.desc_set = *desc_set;
  local_3c.binding =
       *(uint32_t *)
        itr.
        super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
        ._M_cur;
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_map<spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>_>_>
       ::find(&this->resource_bindings,&local_3c);
  remap = (pair<spirv_cross::HLSLResourceBinding,_bool> *)
          ::std::
          end<std::unordered_map<spirv_cross::StageSetBinding,std::pair<spirv_cross::HLSLResourceBinding,bool>,spirv_cross::InternalHasher,std::equal_to<spirv_cross::StageSetBinding>,std::allocator<std::pair<spirv_cross::StageSetBinding_const,std::pair<spirv_cross::HLSLResourceBinding,bool>>>>>
                    (&this->resource_bindings);
  bVar1 = ::std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
                      *)&remap);
  if (bVar1) {
    ppVar2 = ::std::__detail::
             _Node_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_false,_true>
                           *)&local_30);
    (ppVar2->second).second = true;
    switch(type) {
    case HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT:
    case HLSL_BINDING_AUTO_CBV_BIT:
      *desc_set = (ppVar2->second).first.cbv.register_space;
      *(uint32_t *)
       itr.
       super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
       ._M_cur = (ppVar2->second).first.cbv.register_binding;
      break;
    default:
      break;
    case HLSL_BINDING_AUTO_SRV_BIT:
      *desc_set = (ppVar2->second).first.srv.register_space;
      *(uint32_t *)
       itr.
       super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
       ._M_cur = (ppVar2->second).first.srv.register_binding;
      break;
    case HLSL_BINDING_AUTO_UAV_BIT:
      *desc_set = (ppVar2->second).first.uav.register_space;
      *(uint32_t *)
       itr.
       super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
       ._M_cur = (ppVar2->second).first.uav.register_binding;
      break;
    case HLSL_BINDING_AUTO_SAMPLER_BIT:
      *desc_set = (ppVar2->second).first.sampler.register_space;
      *(uint32_t *)
       itr.
       super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::HLSLResourceBinding,_bool>_>,_true>
       ._M_cur = (ppVar2->second).first.sampler.register_binding;
    }
  }
  return;
}

Assistant:

void CompilerHLSL::remap_hlsl_resource_binding(HLSLBindingFlagBits type, uint32_t &desc_set, uint32_t &binding)
{
	auto itr = resource_bindings.find({ get_execution_model(), desc_set, binding });
	if (itr != end(resource_bindings))
	{
		auto &remap = itr->second;
		remap.second = true;

		switch (type)
		{
		case HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT:
		case HLSL_BINDING_AUTO_CBV_BIT:
			desc_set = remap.first.cbv.register_space;
			binding = remap.first.cbv.register_binding;
			break;

		case HLSL_BINDING_AUTO_SRV_BIT:
			desc_set = remap.first.srv.register_space;
			binding = remap.first.srv.register_binding;
			break;

		case HLSL_BINDING_AUTO_SAMPLER_BIT:
			desc_set = remap.first.sampler.register_space;
			binding = remap.first.sampler.register_binding;
			break;

		case HLSL_BINDING_AUTO_UAV_BIT:
			desc_set = remap.first.uav.register_space;
			binding = remap.first.uav.register_binding;
			break;

		default:
			break;
		}
	}
}